

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzlib.c
# Opt level: O0

Int32 BZ2_indexIntoF(Int32 indx,Int32 *cftab)

{
  Int32 IVar1;
  int iVar2;
  Int32 mid;
  Int32 na;
  Int32 nb;
  Int32 *cftab_local;
  Int32 indx_local;
  
  nb = 0;
  na = 0x100;
  do {
    iVar2 = nb + na >> 1;
    IVar1 = iVar2;
    if (cftab[iVar2] <= indx) {
      IVar1 = na;
      nb = iVar2;
    }
    na = IVar1;
  } while (na - nb != 1);
  return nb;
}

Assistant:

__inline__ Int32 BZ2_indexIntoF ( Int32 indx, Int32 *cftab )
{
   Int32 nb, na, mid;
   nb = 0;
   na = 256;
   do {
      mid = (nb + na) >> 1;
      if (indx >= cftab[mid]) nb = mid; else na = mid;
   }
   while (na - nb != 1);
   return nb;
}